

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O3

void gen_VNMUL_sp(TCGContext_conflict1 *tcg_ctx,TCGv_i32 vd,TCGv_i32 vn,TCGv_i32 vm,TCGv_ptr fpst)

{
  TCGTemp *ret;
  TCGTemp *args [3];
  TCGTemp *local_38;
  TCGv_i32 local_30;
  TCGv_ptr local_28;
  
  local_38 = (TCGTemp *)(vn + (long)tcg_ctx);
  local_30 = vm + (long)tcg_ctx;
  local_28 = fpst + (long)tcg_ctx;
  ret = (TCGTemp *)(vd + (long)tcg_ctx);
  tcg_gen_callN_aarch64(tcg_ctx,helper_vfp_muls_aarch64,ret,3,&local_38);
  local_38 = ret;
  tcg_gen_callN_aarch64(tcg_ctx,helper_vfp_negs_aarch64,ret,1,&local_38);
  return;
}

Assistant:

static void gen_VNMUL_sp(TCGContext *tcg_ctx, TCGv_i32 vd, TCGv_i32 vn, TCGv_i32 vm, TCGv_ptr fpst)
{
    /* VNMUL: -(fn * fm) */
    gen_helper_vfp_muls(tcg_ctx, vd, vn, vm, fpst);
    gen_helper_vfp_negs(tcg_ctx, vd, vd);
}